

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# groupnorm_x86_avx.cpp
# Opt level: O2

int __thiscall
ncnn::GroupNorm_x86_avx::forward_inplace(GroupNorm_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  float *pfVar1;
  float *pfVar2;
  _func_int **pp_Var3;
  void *pvVar4;
  _func_int **pp_Var5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  int q_1;
  int iVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  int iVar17;
  long lVar18;
  float *pfVar19;
  undefined1 (*pauVar20) [32];
  int iVar21;
  long lVar22;
  long lVar23;
  undefined1 (*pauVar24) [16];
  int iVar25;
  ulong uVar26;
  int q;
  long lVar27;
  long lVar28;
  int iVar29;
  _func_int *p_Var30;
  float *beta;
  float *pfVar31;
  long lVar32;
  ulong uVar33;
  float *gamma;
  undefined1 (*pauVar34) [32];
  float fVar35;
  float fVar42;
  float fVar43;
  float fVar44;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  float fVar55;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  float fVar61;
  undefined1 auVar60 [32];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  float fVar71;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  float fVar72;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 in_ZMM10 [64];
  float in_register_0000151c;
  
  iVar29 = bottom_top_blob->dims;
  pp_Var3 = this->_vptr_GroupNorm_x86_avx;
  p_Var30 = pp_Var3[-3];
  iVar21 = *(int *)(&this->field_0xd0 + (long)p_Var30);
  uVar16 = (long)*(int *)(&this->field_0xd4 + (long)p_Var30) / (long)iVar21;
  iVar12 = (int)uVar16;
  lVar13 = (long)iVar12;
  if (iVar29 == 2) {
    iVar29 = bottom_top_blob->w;
    iVar17 = iVar29 * iVar12;
    lVar14 = 0;
    if (iVar12 < 1) {
      iVar12 = 0;
    }
    for (lVar18 = 0; lVar18 < iVar21; lVar18 = lVar18 + 1) {
      lVar22 = lVar18 * lVar13;
      pvVar4 = bottom_top_blob->data;
      pauVar34 = (undefined1 (*) [32])
                 (lVar22 * bottom_top_blob->w * bottom_top_blob->elemsize + (long)pvVar4);
      fVar43 = 0.0;
      fVar44 = 0.0;
      fVar35 = 0.0;
      fVar42 = 0.0;
      fVar45 = 0.0;
      fVar46 = 0.0;
      fVar47 = 0.0;
      fVar48 = 0.0;
      lVar27 = 0;
      pauVar20 = pauVar34;
      for (iVar21 = 0; iVar21 + 7 < iVar17; iVar21 = iVar21 + 8) {
        fVar35 = fVar35 + *(float *)*pauVar20;
        fVar42 = fVar42 + *(float *)(*pauVar20 + 4);
        fVar43 = fVar43 + *(float *)(*pauVar20 + 8);
        fVar44 = fVar44 + *(float *)(*pauVar20 + 0xc);
        fVar45 = fVar45 + *(float *)(*pauVar20 + 0x10);
        fVar46 = fVar46 + *(float *)(*pauVar20 + 0x14);
        fVar47 = fVar47 + *(float *)(*pauVar20 + 0x18);
        fVar48 = fVar48 + *(float *)(*pauVar20 + 0x1c);
        pauVar20 = pauVar20 + 1;
        lVar27 = lVar27 + 8;
      }
      pfVar19 = (float *)(*(long *)(&this->field_0xe0 + (long)p_Var30) +
                         *(long *)(&this->field_0xf0 + (long)p_Var30) * lVar22);
      auVar39._0_4_ = fVar45 + fVar35;
      auVar39._4_4_ = fVar46 + fVar42;
      auVar39._8_4_ = fVar47 + fVar43;
      auVar39._12_4_ = fVar48 + fVar44;
      auVar51 = vshufpd_avx(auVar39,auVar39,1);
      auVar40._0_4_ = auVar51._0_4_ + auVar39._0_4_;
      auVar40._4_4_ = auVar51._4_4_ + auVar39._4_4_;
      auVar40._8_4_ = auVar51._8_4_ + auVar39._8_4_;
      auVar40._12_4_ = auVar51._12_4_ + auVar39._12_4_;
      auVar51 = ZEXT816(0) << 0x40;
      while( true ) {
        fVar43 = auVar51._4_4_;
        fVar44 = auVar51._8_4_;
        fVar35 = auVar51._12_4_;
        if (iVar17 <= iVar21 + 3) break;
        auVar51._0_4_ = auVar51._0_4_ + *(float *)*pauVar20;
        auVar51._4_4_ = fVar43 + *(float *)(*pauVar20 + 4);
        auVar51._8_4_ = fVar44 + *(float *)(*pauVar20 + 8);
        auVar51._12_4_ = fVar35 + *(float *)(*pauVar20 + 0xc);
        pauVar20 = (undefined1 (*) [32])(*pauVar20 + 0x10);
        iVar21 = iVar21 + 4;
        lVar27 = lVar27 + 4;
      }
      auVar39 = vshufpd_avx(auVar51,auVar51,1);
      auVar52._0_4_ = auVar39._0_4_ + auVar51._0_4_;
      auVar52._4_4_ = auVar39._4_4_ + fVar43;
      auVar52._8_4_ = auVar39._8_4_ + fVar44;
      auVar52._12_4_ = auVar39._12_4_ + fVar35;
      auVar39 = vmovshdup_avx(auVar52);
      auVar51 = vhaddps_avx(auVar40,auVar40);
      fVar43 = auVar51._0_4_ + auVar39._0_4_ + auVar52._0_4_;
      lVar23 = bottom_top_blob->elemsize * lVar14 * (long)bottom_top_blob->w;
      for (; (int)lVar27 < iVar17; lVar27 = lVar27 + 1) {
        fVar43 = fVar43 + *(float *)((long)pvVar4 + lVar27 * 4 + lVar23);
      }
      fVar43 = fVar43 * (1.0 / (float)iVar17);
      auVar51 = vshufps_avx(ZEXT416((uint)fVar43),ZEXT416((uint)fVar43),0);
      auVar67._16_16_ = auVar51;
      auVar67._0_16_ = auVar51;
      lVar27 = 0;
      fVar44 = 0.0;
      fVar35 = 0.0;
      fVar42 = 0.0;
      fVar45 = 0.0;
      fVar46 = 0.0;
      fVar47 = 0.0;
      fVar48 = 0.0;
      fVar61 = 0.0;
      pauVar20 = pauVar34;
      for (iVar21 = 0; iVar21 + 7 < iVar17; iVar21 = iVar21 + 8) {
        auVar79 = vsubps_avx(*pauVar20,auVar67);
        fVar44 = auVar79._0_4_ * auVar79._0_4_ + fVar44;
        fVar35 = auVar79._4_4_ * auVar79._4_4_ + fVar35;
        fVar42 = auVar79._8_4_ * auVar79._8_4_ + fVar42;
        fVar45 = auVar79._12_4_ * auVar79._12_4_ + fVar45;
        fVar46 = auVar79._16_4_ * auVar79._16_4_ + fVar46;
        fVar47 = auVar79._20_4_ * auVar79._20_4_ + fVar47;
        fVar48 = auVar79._24_4_ * auVar79._24_4_ + fVar48;
        fVar61 = auVar79._28_4_ + fVar61;
        pauVar20 = pauVar20 + 1;
        lVar27 = lVar27 + 8;
      }
      auVar58._0_4_ = fVar46 + fVar44;
      auVar58._4_4_ = fVar47 + fVar35;
      auVar58._8_4_ = fVar48 + fVar42;
      auVar58._12_4_ = fVar61 + fVar45;
      auVar39 = vshufpd_avx(auVar58,auVar58,1);
      auVar59._0_4_ = auVar39._0_4_ + auVar58._0_4_;
      auVar59._4_4_ = auVar39._4_4_ + auVar58._4_4_;
      auVar59._8_4_ = auVar39._8_4_ + auVar58._8_4_;
      auVar59._12_4_ = auVar39._12_4_ + auVar58._12_4_;
      auVar63 = ZEXT816(0) << 0x40;
      while( true ) {
        fVar44 = auVar63._4_4_;
        fVar35 = auVar63._8_4_;
        fVar42 = auVar63._12_4_;
        if (iVar17 <= iVar21 + 3) break;
        auVar39 = vsubps_avx(*(undefined1 (*) [16])*pauVar20,auVar51);
        auVar63._0_4_ = auVar39._0_4_ * auVar39._0_4_ + auVar63._0_4_;
        auVar63._4_4_ = auVar39._4_4_ * auVar39._4_4_ + fVar44;
        auVar63._8_4_ = auVar39._8_4_ * auVar39._8_4_ + fVar35;
        auVar63._12_4_ = auVar39._12_4_ * auVar39._12_4_ + fVar42;
        pauVar20 = (undefined1 (*) [32])(*pauVar20 + 0x10);
        iVar21 = iVar21 + 4;
        lVar27 = lVar27 + 4;
      }
      auVar39 = vshufpd_avx(auVar63,auVar63,1);
      auVar51 = vhaddps_avx(auVar59,auVar59);
      auVar41._0_4_ = auVar39._0_4_ + auVar63._0_4_;
      auVar41._4_4_ = auVar39._4_4_ + fVar44;
      auVar41._8_4_ = auVar39._8_4_ + fVar35;
      auVar41._12_4_ = auVar39._12_4_ + fVar42;
      auVar39 = vmovshdup_avx(auVar41);
      fVar44 = auVar51._0_4_ + auVar39._0_4_ + auVar41._0_4_;
      for (; (int)lVar27 < iVar17; lVar27 = lVar27 + 1) {
        fVar35 = *(float *)((long)pvVar4 + lVar27 * 4 + lVar23) - fVar43;
        fVar44 = fVar35 * fVar35 + fVar44;
      }
      fVar44 = fVar44 * (1.0 / (float)iVar17) + *(float *)(&this->field_0xd8 + (long)p_Var30);
      auVar51 = vrsqrtss_avx(ZEXT416((uint)fVar44),ZEXT416((uint)fVar44));
      fVar35 = auVar51._0_4_;
      fVar44 = fVar35 * -0.5 * (fVar44 * fVar35 * fVar35 + -3.0);
      fVar43 = fVar44 * -fVar43;
      if (*(int *)(&this->field_0xdc + (long)p_Var30) == 0) {
        auVar51 = vshufps_avx(ZEXT416((uint)fVar44),ZEXT416((uint)fVar44),0);
        auVar39 = vshufps_avx(ZEXT416((uint)fVar43),ZEXT416((uint)fVar43),0);
        lVar22 = 0;
        iVar21 = 0;
        while( true ) {
          fVar47 = auVar51._0_4_;
          fVar48 = auVar51._4_4_;
          fVar61 = auVar51._8_4_;
          fVar35 = auVar39._0_4_;
          fVar42 = auVar39._4_4_;
          fVar45 = auVar39._8_4_;
          fVar46 = auVar39._12_4_;
          if (iVar17 <= iVar21 + 7) break;
          auVar79._0_4_ = fVar47 * *(float *)*pauVar34 + fVar35;
          auVar79._4_4_ = fVar48 * *(float *)(*pauVar34 + 4) + fVar42;
          auVar79._8_4_ = fVar61 * *(float *)(*pauVar34 + 8) + fVar45;
          auVar79._12_4_ = auVar51._12_4_ * *(float *)(*pauVar34 + 0xc) + fVar46;
          auVar79._16_4_ = fVar47 * *(float *)(*pauVar34 + 0x10) + fVar35;
          auVar79._20_4_ = fVar48 * *(float *)(*pauVar34 + 0x14) + fVar42;
          auVar79._24_4_ = fVar61 * *(float *)(*pauVar34 + 0x18) + fVar45;
          auVar79._28_4_ = in_ZMM10._28_4_ + fVar46;
          in_ZMM10 = ZEXT3264(auVar79);
          *pauVar34 = auVar79;
          pauVar34 = pauVar34 + 1;
          iVar21 = iVar21 + 8;
          lVar22 = lVar22 + 8;
        }
        for (; iVar21 + 3 < iVar17; iVar21 = iVar21 + 4) {
          auVar68._0_4_ = fVar47 * *(float *)*pauVar34 + fVar35;
          auVar68._4_4_ = fVar48 * *(float *)(*pauVar34 + 4) + fVar42;
          auVar68._8_4_ = fVar61 * *(float *)(*pauVar34 + 8) + fVar45;
          auVar68._12_4_ = auVar51._12_4_ * *(float *)(*pauVar34 + 0xc) + fVar46;
          *(undefined1 (*) [16])*pauVar34 = auVar68;
          pauVar34 = (undefined1 (*) [32])(*pauVar34 + 0x10);
          lVar22 = lVar22 + 4;
        }
        for (; (int)lVar22 < iVar17; lVar22 = lVar22 + 1) {
          *(float *)((long)pvVar4 + lVar22 * 4 + lVar23) =
               fVar44 * *(float *)((long)pvVar4 + lVar22 * 4 + lVar23) + fVar43;
        }
      }
      else {
        pfVar31 = (float *)(*(long *)(&this->field_0x128 + (long)p_Var30) +
                           lVar22 * *(long *)(&this->field_0x138 + (long)p_Var30));
        for (iVar21 = 0; iVar21 != iVar12; iVar21 = iVar21 + 1) {
          fVar42 = *pfVar19 * fVar44;
          fVar35 = *pfVar19 * fVar43 + *pfVar31;
          auVar51 = vshufps_avx(ZEXT416((uint)fVar42),ZEXT416((uint)fVar42),0);
          in_ZMM10 = ZEXT3264(CONCAT1616(auVar51,auVar51));
          auVar39 = vshufps_avx(ZEXT416((uint)fVar35),ZEXT416((uint)fVar35),0);
          iVar25 = 0;
          while( true ) {
            fVar61 = auVar51._0_4_;
            fVar55 = auVar51._4_4_;
            fVar72 = auVar51._8_4_;
            fVar45 = auVar39._0_4_;
            fVar46 = auVar39._4_4_;
            fVar47 = auVar39._8_4_;
            fVar48 = auVar39._12_4_;
            if (iVar29 <= iVar25 + 7) break;
            fVar71 = *(float *)(*pauVar34 + 4);
            fVar6 = *(float *)(*pauVar34 + 8);
            fVar7 = *(float *)(*pauVar34 + 0xc);
            fVar8 = *(float *)(*pauVar34 + 0x10);
            fVar9 = *(float *)(*pauVar34 + 0x14);
            fVar10 = *(float *)(*pauVar34 + 0x18);
            in_register_0000151c = in_register_0000151c + fVar48;
            *(float *)*pauVar34 = fVar61 * *(float *)*pauVar34 + fVar45;
            *(float *)(*pauVar34 + 4) = fVar55 * fVar71 + fVar46;
            *(float *)(*pauVar34 + 8) = fVar72 * fVar6 + fVar47;
            *(float *)(*pauVar34 + 0xc) = auVar51._12_4_ * fVar7 + fVar48;
            *(float *)(*pauVar34 + 0x10) = fVar61 * fVar8 + fVar45;
            *(float *)(*pauVar34 + 0x14) = fVar55 * fVar9 + fVar46;
            *(float *)(*pauVar34 + 0x18) = fVar72 * fVar10 + fVar47;
            *(float *)(*pauVar34 + 0x1c) = in_register_0000151c;
            pauVar34 = pauVar34 + 1;
            iVar25 = iVar25 + 8;
          }
          for (; iVar25 + 3 < iVar29; iVar25 = iVar25 + 4) {
            auVar73._0_4_ = fVar61 * *(float *)*pauVar34 + fVar45;
            auVar73._4_4_ = fVar55 * *(float *)(*pauVar34 + 4) + fVar46;
            auVar73._8_4_ = fVar72 * *(float *)(*pauVar34 + 8) + fVar47;
            auVar73._12_4_ = auVar51._12_4_ * *(float *)(*pauVar34 + 0xc) + fVar48;
            in_ZMM10 = ZEXT1664(auVar73);
            *(undefined1 (*) [16])*pauVar34 = auVar73;
            pauVar34 = (undefined1 (*) [32])(*pauVar34 + 0x10);
          }
          for (; iVar25 < iVar29; iVar25 = iVar25 + 1) {
            *(float *)*pauVar34 = fVar42 * *(float *)*pauVar34 + fVar35;
            pauVar34 = (undefined1 (*) [32])(*pauVar34 + 4);
          }
          pfVar19 = pfVar19 + 1;
          pfVar31 = pfVar31 + 1;
        }
      }
      p_Var30 = pp_Var3[-3];
      iVar21 = *(int *)(&this->field_0xd0 + (long)p_Var30);
      lVar14 = lVar14 + lVar13;
    }
  }
  else if (iVar29 == 1) {
    lVar14 = 0;
    for (lVar18 = 0; lVar18 < iVar21; lVar18 = lVar18 + 1) {
      pvVar4 = bottom_top_blob->data;
      pauVar34 = (undefined1 (*) [32])(lVar18 * lVar13 * bottom_top_blob->elemsize + (long)pvVar4);
      lVar22 = 0;
      fVar43 = 0.0;
      fVar44 = 0.0;
      fVar35 = 0.0;
      fVar42 = 0.0;
      fVar45 = 0.0;
      fVar46 = 0.0;
      fVar47 = 0.0;
      fVar48 = 0.0;
      pauVar20 = pauVar34;
      for (iVar29 = 0; iVar29 + 7 < iVar12; iVar29 = iVar29 + 8) {
        fVar35 = fVar35 + *(float *)*pauVar20;
        fVar42 = fVar42 + *(float *)(*pauVar20 + 4);
        fVar43 = fVar43 + *(float *)(*pauVar20 + 8);
        fVar44 = fVar44 + *(float *)(*pauVar20 + 0xc);
        fVar45 = fVar45 + *(float *)(*pauVar20 + 0x10);
        fVar46 = fVar46 + *(float *)(*pauVar20 + 0x14);
        fVar47 = fVar47 + *(float *)(*pauVar20 + 0x18);
        fVar48 = fVar48 + *(float *)(*pauVar20 + 0x1c);
        pauVar20 = pauVar20 + 1;
        lVar22 = lVar22 + 8;
      }
      auVar36._0_4_ = fVar45 + fVar35;
      auVar36._4_4_ = fVar46 + fVar42;
      auVar36._8_4_ = fVar47 + fVar43;
      auVar36._12_4_ = fVar48 + fVar44;
      auVar51 = vshufpd_avx(auVar36,auVar36,1);
      auVar37._0_4_ = auVar51._0_4_ + auVar36._0_4_;
      auVar37._4_4_ = auVar51._4_4_ + auVar36._4_4_;
      auVar37._8_4_ = auVar51._8_4_ + auVar36._8_4_;
      auVar37._12_4_ = auVar51._12_4_ + auVar36._12_4_;
      auVar49 = ZEXT816(0) << 0x40;
      while( true ) {
        fVar43 = auVar49._4_4_;
        fVar44 = auVar49._8_4_;
        fVar35 = auVar49._12_4_;
        if (iVar12 <= iVar29 + 3) break;
        auVar49._0_4_ = auVar49._0_4_ + *(float *)*pauVar20;
        auVar49._4_4_ = fVar43 + *(float *)(*pauVar20 + 4);
        auVar49._8_4_ = fVar44 + *(float *)(*pauVar20 + 8);
        auVar49._12_4_ = fVar35 + *(float *)(*pauVar20 + 0xc);
        pauVar20 = (undefined1 (*) [32])(*pauVar20 + 0x10);
        iVar29 = iVar29 + 4;
        lVar22 = lVar22 + 4;
      }
      auVar51 = vshufpd_avx(auVar49,auVar49,1);
      auVar50._0_4_ = auVar51._0_4_ + auVar49._0_4_;
      auVar50._4_4_ = auVar51._4_4_ + fVar43;
      auVar50._8_4_ = auVar51._8_4_ + fVar44;
      auVar50._12_4_ = auVar51._12_4_ + fVar35;
      auVar39 = vmovshdup_avx(auVar50);
      auVar51 = vhaddps_avx(auVar37,auVar37);
      fVar43 = auVar51._0_4_ + auVar39._0_4_ + auVar50._0_4_;
      lVar27 = bottom_top_blob->elemsize * lVar14;
      for (; (int)lVar22 < iVar12; lVar22 = lVar22 + 1) {
        fVar43 = fVar43 + *(float *)((long)pvVar4 + lVar22 * 4 + lVar27);
      }
      fVar43 = fVar43 * (1.0 / (float)iVar12);
      auVar51 = vshufps_avx(ZEXT416((uint)fVar43),ZEXT416((uint)fVar43),0);
      auVar66._16_16_ = auVar51;
      auVar66._0_16_ = auVar51;
      lVar22 = 0;
      fVar44 = 0.0;
      fVar35 = 0.0;
      fVar42 = 0.0;
      fVar45 = 0.0;
      fVar46 = 0.0;
      fVar47 = 0.0;
      fVar48 = 0.0;
      fVar61 = 0.0;
      pauVar20 = pauVar34;
      for (iVar29 = 0; iVar29 + 7 < iVar12; iVar29 = iVar29 + 8) {
        auVar67 = vsubps_avx(*pauVar20,auVar66);
        fVar44 = auVar67._0_4_ * auVar67._0_4_ + fVar44;
        fVar35 = auVar67._4_4_ * auVar67._4_4_ + fVar35;
        fVar42 = auVar67._8_4_ * auVar67._8_4_ + fVar42;
        fVar45 = auVar67._12_4_ * auVar67._12_4_ + fVar45;
        fVar46 = auVar67._16_4_ * auVar67._16_4_ + fVar46;
        fVar47 = auVar67._20_4_ * auVar67._20_4_ + fVar47;
        fVar48 = auVar67._24_4_ * auVar67._24_4_ + fVar48;
        fVar61 = auVar67._28_4_ + fVar61;
        pauVar20 = pauVar20 + 1;
        lVar22 = lVar22 + 8;
      }
      auVar56._0_4_ = fVar46 + fVar44;
      auVar56._4_4_ = fVar47 + fVar35;
      auVar56._8_4_ = fVar48 + fVar42;
      auVar56._12_4_ = fVar61 + fVar45;
      auVar39 = vshufpd_avx(auVar56,auVar56,1);
      auVar57._0_4_ = auVar39._0_4_ + auVar56._0_4_;
      auVar57._4_4_ = auVar39._4_4_ + auVar56._4_4_;
      auVar57._8_4_ = auVar39._8_4_ + auVar56._8_4_;
      auVar57._12_4_ = auVar39._12_4_ + auVar56._12_4_;
      auVar62 = ZEXT816(0) << 0x40;
      while( true ) {
        fVar44 = auVar62._4_4_;
        fVar35 = auVar62._8_4_;
        fVar42 = auVar62._12_4_;
        if (iVar12 <= iVar29 + 3) break;
        auVar39 = vsubps_avx(*(undefined1 (*) [16])*pauVar20,auVar51);
        auVar62._0_4_ = auVar39._0_4_ * auVar39._0_4_ + auVar62._0_4_;
        auVar62._4_4_ = auVar39._4_4_ * auVar39._4_4_ + fVar44;
        auVar62._8_4_ = auVar39._8_4_ * auVar39._8_4_ + fVar35;
        auVar62._12_4_ = auVar39._12_4_ * auVar39._12_4_ + fVar42;
        pauVar20 = (undefined1 (*) [32])(*pauVar20 + 0x10);
        iVar29 = iVar29 + 4;
        lVar22 = lVar22 + 4;
      }
      auVar39 = vshufpd_avx(auVar62,auVar62,1);
      auVar51 = vhaddps_avx(auVar57,auVar57);
      auVar38._0_4_ = auVar39._0_4_ + auVar62._0_4_;
      auVar38._4_4_ = auVar39._4_4_ + fVar44;
      auVar38._8_4_ = auVar39._8_4_ + fVar35;
      auVar38._12_4_ = auVar39._12_4_ + fVar42;
      auVar39 = vmovshdup_avx(auVar38);
      fVar44 = auVar51._0_4_ + auVar39._0_4_ + auVar38._0_4_;
      for (; (int)lVar22 < iVar12; lVar22 = lVar22 + 1) {
        fVar35 = *(float *)((long)pvVar4 + lVar22 * 4 + lVar27) - fVar43;
        fVar44 = fVar35 * fVar35 + fVar44;
      }
      fVar44 = fVar44 * (1.0 / (float)iVar12) + *(float *)(&this->field_0xd8 + (long)p_Var30);
      auVar51 = vrsqrtss_avx(ZEXT416((uint)fVar44),ZEXT416((uint)fVar44));
      fVar35 = auVar51._0_4_;
      fVar44 = fVar35 * -0.5 * (fVar44 * fVar35 * fVar35 + -3.0);
      fVar43 = fVar44 * -fVar43;
      auVar51 = ZEXT416((uint)fVar44);
      if (*(int *)(&this->field_0xdc + (long)p_Var30) == 0) {
        auVar51 = vshufps_avx(auVar51,auVar51,0);
        auVar39 = vshufps_avx(ZEXT416((uint)fVar43),ZEXT416((uint)fVar43),0);
        lVar22 = 0;
        iVar29 = 0;
        while( true ) {
          fVar35 = auVar39._0_4_;
          fVar42 = auVar39._4_4_;
          fVar45 = auVar39._8_4_;
          fVar46 = auVar39._12_4_;
          fVar47 = auVar51._0_4_;
          fVar48 = auVar51._4_4_;
          fVar61 = auVar51._8_4_;
          if (iVar12 <= iVar29 + 7) break;
          auVar78._0_4_ = fVar47 * *(float *)*pauVar34 + fVar35;
          auVar78._4_4_ = fVar48 * *(float *)(*pauVar34 + 4) + fVar42;
          auVar78._8_4_ = fVar61 * *(float *)(*pauVar34 + 8) + fVar45;
          auVar78._12_4_ = auVar51._12_4_ * *(float *)(*pauVar34 + 0xc) + fVar46;
          auVar78._16_4_ = fVar47 * *(float *)(*pauVar34 + 0x10) + fVar35;
          auVar78._20_4_ = fVar48 * *(float *)(*pauVar34 + 0x14) + fVar42;
          auVar78._24_4_ = fVar61 * *(float *)(*pauVar34 + 0x18) + fVar45;
          auVar78._28_4_ = in_ZMM10._28_4_ + fVar46;
          in_ZMM10 = ZEXT3264(auVar78);
          *pauVar34 = auVar78;
          pauVar34 = pauVar34 + 1;
          iVar29 = iVar29 + 8;
          lVar22 = lVar22 + 8;
        }
        for (; iVar29 + 3 < iVar12; iVar29 = iVar29 + 4) {
          fVar55 = *(float *)(*pauVar34 + 4);
          fVar72 = *(float *)(*pauVar34 + 8);
          fVar71 = *(float *)(*pauVar34 + 0xc);
          *(float *)*pauVar34 = fVar47 * *(float *)*pauVar34 + fVar35;
          *(float *)(*pauVar34 + 4) = fVar48 * fVar55 + fVar42;
          *(float *)(*pauVar34 + 8) = fVar61 * fVar72 + fVar45;
          *(float *)(*pauVar34 + 0xc) = auVar51._12_4_ * fVar71 + fVar46;
          pauVar34 = (undefined1 (*) [32])(*pauVar34 + 0x10);
          lVar22 = lVar22 + 4;
        }
        for (; (int)lVar22 < iVar12; lVar22 = lVar22 + 1) {
          *(float *)((long)pvVar4 + lVar22 * 4 + lVar27) =
               fVar44 * *(float *)((long)pvVar4 + lVar22 * 4 + lVar27) + fVar43;
        }
      }
      else {
        auVar51 = vshufps_avx(auVar51,auVar51,0);
        auVar39 = vshufps_avx(ZEXT416((uint)fVar43),ZEXT416((uint)fVar43),0);
        lVar32 = *(long *)(&this->field_0x128 + (long)p_Var30) +
                 *(long *)(&this->field_0x138 + (long)p_Var30) * lVar14;
        lVar22 = *(long *)(&this->field_0xe0 + (long)p_Var30) +
                 *(long *)(&this->field_0xf0 + (long)p_Var30) * lVar14;
        lVar23 = 0;
        lVar28 = 0;
        iVar29 = 0;
        while( true ) {
          fVar35 = auVar39._0_4_;
          fVar42 = auVar39._4_4_;
          fVar45 = auVar39._8_4_;
          fVar46 = auVar39._12_4_;
          fVar47 = auVar51._0_4_;
          fVar48 = auVar51._4_4_;
          fVar61 = auVar51._8_4_;
          if (iVar12 <= iVar29 + 7) break;
          pfVar19 = (float *)((long)pvVar4 + lVar28 + lVar27);
          pfVar31 = (float *)(lVar22 + lVar28);
          pfVar1 = (float *)(lVar32 + lVar28);
          auVar77._0_4_ = (fVar47 * *pfVar19 + fVar35) * *pfVar31 + *pfVar1;
          auVar77._4_4_ = (fVar48 * pfVar19[1] + fVar42) * pfVar31[1] + pfVar1[1];
          auVar77._8_4_ = (fVar61 * pfVar19[2] + fVar45) * pfVar31[2] + pfVar1[2];
          auVar77._12_4_ = (auVar51._12_4_ * pfVar19[3] + fVar46) * pfVar31[3] + pfVar1[3];
          auVar77._16_4_ = (fVar47 * pfVar19[4] + fVar35) * pfVar31[4] + pfVar1[4];
          auVar77._20_4_ = (fVar48 * pfVar19[5] + fVar42) * pfVar31[5] + pfVar1[5];
          auVar77._24_4_ = (fVar61 * pfVar19[6] + fVar45) * pfVar31[6] + pfVar1[6];
          auVar77._28_4_ = in_ZMM10._28_4_ + fVar46 + pfVar1[7];
          in_ZMM10 = ZEXT3264(auVar77);
          *(undefined1 (*) [32])((long)pvVar4 + lVar28 + lVar27) = auVar77;
          iVar29 = iVar29 + 8;
          lVar28 = lVar28 + 0x20;
          lVar23 = lVar23 + 8;
        }
        for (; iVar29 + 3 < iVar12; iVar29 = iVar29 + 4) {
          pfVar19 = (float *)((long)pvVar4 + lVar28 + lVar27);
          fVar55 = pfVar19[1];
          fVar72 = pfVar19[2];
          fVar71 = pfVar19[3];
          pfVar31 = (float *)(lVar22 + lVar28);
          fVar6 = pfVar31[1];
          fVar7 = pfVar31[2];
          fVar8 = pfVar31[3];
          pfVar1 = (float *)(lVar32 + lVar28);
          fVar9 = pfVar1[1];
          fVar10 = pfVar1[2];
          fVar11 = pfVar1[3];
          pfVar2 = (float *)((long)pvVar4 + lVar28 + lVar27);
          *pfVar2 = (fVar47 * *pfVar19 + fVar35) * *pfVar31 + *pfVar1;
          pfVar2[1] = (fVar48 * fVar55 + fVar42) * fVar6 + fVar9;
          pfVar2[2] = (fVar61 * fVar72 + fVar45) * fVar7 + fVar10;
          pfVar2[3] = (auVar51._12_4_ * fVar71 + fVar46) * fVar8 + fVar11;
          lVar28 = lVar28 + 0x10;
          lVar23 = lVar23 + 4;
        }
        for (; (int)lVar23 < iVar12; lVar23 = lVar23 + 1) {
          *(float *)((long)pvVar4 + lVar23 * 4 + lVar27) =
               (fVar44 * *(float *)((long)pvVar4 + lVar23 * 4 + lVar27) + fVar43) *
               *(float *)(lVar22 + lVar23 * 4) + *(float *)(lVar32 + lVar23 * 4);
        }
      }
      p_Var30 = pp_Var3[-3];
      iVar21 = *(int *)(&this->field_0xd0 + (long)p_Var30);
      lVar14 = lVar14 + lVar13;
    }
  }
  else if (iVar29 - 3U < 2) {
    iVar29 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d;
    uVar33 = 0;
    uVar16 = uVar16 & 0xffffffff;
    if (iVar12 < 1) {
      uVar16 = uVar33;
    }
    fVar43 = 1.0 / (float)(iVar29 * iVar12);
    for (; (long)uVar33 < (long)iVar21; uVar33 = uVar33 + 1) {
      lVar14 = uVar33 * lVar13;
      uVar15 = bottom_top_blob->elemsize;
      lVar22 = bottom_top_blob->cstep * lVar14 * uVar15;
      pvVar4 = bottom_top_blob->data;
      uVar26 = (long)bottom_top_blob->d * uVar15 *
               (long)bottom_top_blob->h * (long)bottom_top_blob->w + 0xf & 0xfffffffffffffff0;
      lVar18 = uVar26 - uVar26 % uVar15;
      fVar44 = 0.0;
      for (uVar15 = 0; uVar15 != uVar16; uVar15 = uVar15 + 1) {
        pfVar19 = (float *)((long)pvVar4 + lVar18 * uVar15 + lVar22);
        fVar35 = 0.0;
        fVar42 = 0.0;
        fVar45 = 0.0;
        fVar46 = 0.0;
        fVar47 = 0.0;
        fVar48 = 0.0;
        fVar61 = 0.0;
        fVar55 = 0.0;
        for (iVar21 = 0; iVar21 + 7 < iVar29; iVar21 = iVar21 + 8) {
          fVar45 = fVar45 + *pfVar19;
          fVar46 = fVar46 + pfVar19[1];
          fVar35 = fVar35 + pfVar19[2];
          fVar42 = fVar42 + pfVar19[3];
          fVar47 = fVar47 + pfVar19[4];
          fVar48 = fVar48 + pfVar19[5];
          fVar61 = fVar61 + pfVar19[6];
          fVar55 = fVar55 + pfVar19[7];
          pfVar19 = pfVar19 + 8;
        }
        auVar53._0_4_ = fVar47 + fVar45;
        auVar53._4_4_ = fVar48 + fVar46;
        auVar53._8_4_ = fVar61 + fVar35;
        auVar53._12_4_ = fVar55 + fVar42;
        auVar51 = vshufpd_avx(auVar53,auVar53,1);
        auVar54._0_4_ = auVar51._0_4_ + auVar53._0_4_;
        auVar54._4_4_ = auVar51._4_4_ + auVar53._4_4_;
        auVar54._8_4_ = auVar51._8_4_ + auVar53._8_4_;
        auVar54._12_4_ = auVar51._12_4_ + auVar53._12_4_;
        auVar51 = vmovshdup_avx(auVar54);
        auVar64 = ZEXT816(0) << 0x40;
        while( true ) {
          fVar35 = auVar64._4_4_;
          fVar42 = auVar64._8_4_;
          fVar45 = auVar64._12_4_;
          if (iVar29 <= iVar21 + 3) break;
          auVar64._0_4_ = auVar64._0_4_ + *pfVar19;
          auVar64._4_4_ = fVar35 + pfVar19[1];
          auVar64._8_4_ = fVar42 + pfVar19[2];
          auVar64._12_4_ = fVar45 + pfVar19[3];
          pfVar19 = pfVar19 + 4;
          iVar21 = iVar21 + 4;
        }
        auVar39 = vshufpd_avx(auVar64,auVar64,1);
        auVar65._0_4_ = auVar39._0_4_ + auVar64._0_4_;
        auVar65._4_4_ = auVar39._4_4_ + fVar35;
        auVar65._8_4_ = auVar39._8_4_ + fVar42;
        auVar65._12_4_ = auVar39._12_4_ + fVar45;
        auVar39 = vmovshdup_avx(auVar65);
        fVar44 = auVar51._0_4_ + fVar44 + auVar54._0_4_ + auVar39._0_4_ + auVar65._0_4_;
        for (; iVar21 < iVar29; iVar21 = iVar21 + 1) {
          fVar44 = fVar44 + *pfVar19;
          pfVar19 = pfVar19 + 1;
        }
      }
      pfVar19 = (float *)(*(long *)(&this->field_0xe0 + (long)p_Var30) +
                         *(long *)(&this->field_0xf0 + (long)p_Var30) * lVar14);
      fVar44 = fVar44 * fVar43;
      auVar51 = vshufps_avx(ZEXT416((uint)fVar44),ZEXT416((uint)fVar44),0);
      auVar60._16_16_ = auVar51;
      auVar60._0_16_ = auVar51;
      fVar35 = 0.0;
      for (uVar15 = 0; uVar15 != uVar16; uVar15 = uVar15 + 1) {
        pauVar20 = (undefined1 (*) [32])((long)pvVar4 + lVar18 * uVar15 + lVar22);
        fVar42 = 0.0;
        fVar45 = 0.0;
        fVar46 = 0.0;
        fVar47 = 0.0;
        fVar48 = 0.0;
        fVar61 = 0.0;
        fVar55 = 0.0;
        fVar72 = 0.0;
        for (iVar21 = 0; iVar21 + 7 < iVar29; iVar21 = iVar21 + 8) {
          auVar67 = vsubps_avx(*pauVar20,auVar60);
          fVar46 = auVar67._0_4_ * auVar67._0_4_ + fVar46;
          fVar47 = auVar67._4_4_ * auVar67._4_4_ + fVar47;
          fVar42 = auVar67._8_4_ * auVar67._8_4_ + fVar42;
          fVar45 = auVar67._12_4_ * auVar67._12_4_ + fVar45;
          fVar48 = auVar67._16_4_ * auVar67._16_4_ + fVar48;
          fVar61 = auVar67._20_4_ * auVar67._20_4_ + fVar61;
          fVar55 = auVar67._24_4_ * auVar67._24_4_ + fVar55;
          fVar72 = auVar67._28_4_ + fVar72;
          pauVar20 = pauVar20 + 1;
        }
        auVar69._0_4_ = fVar48 + fVar46;
        auVar69._4_4_ = fVar61 + fVar47;
        auVar69._8_4_ = fVar55 + fVar42;
        auVar69._12_4_ = fVar72 + fVar45;
        auVar39 = vshufpd_avx(auVar69,auVar69,1);
        auVar70._0_4_ = auVar39._0_4_ + auVar69._0_4_;
        auVar70._4_4_ = auVar39._4_4_ + auVar69._4_4_;
        auVar70._8_4_ = auVar39._8_4_ + auVar69._8_4_;
        auVar70._12_4_ = auVar39._12_4_ + auVar69._12_4_;
        auVar39 = vmovshdup_avx(auVar70);
        auVar74 = ZEXT816(0) << 0x40;
        while( true ) {
          fVar42 = auVar74._4_4_;
          fVar45 = auVar74._8_4_;
          fVar46 = auVar74._12_4_;
          if (iVar29 <= iVar21 + 3) break;
          auVar40 = vsubps_avx(*(undefined1 (*) [16])*pauVar20,auVar51);
          auVar74._0_4_ = auVar40._0_4_ * auVar40._0_4_ + auVar74._0_4_;
          auVar74._4_4_ = auVar40._4_4_ * auVar40._4_4_ + fVar42;
          auVar74._8_4_ = auVar40._8_4_ * auVar40._8_4_ + fVar45;
          auVar74._12_4_ = auVar40._12_4_ * auVar40._12_4_ + fVar46;
          pauVar20 = (undefined1 (*) [32])(*pauVar20 + 0x10);
          iVar21 = iVar21 + 4;
        }
        auVar40 = vshufpd_avx(auVar74,auVar74,1);
        auVar75._0_4_ = auVar40._0_4_ + auVar74._0_4_;
        auVar75._4_4_ = auVar40._4_4_ + fVar42;
        auVar75._8_4_ = auVar40._8_4_ + fVar45;
        auVar75._12_4_ = auVar40._12_4_ + fVar46;
        auVar40 = vmovshdup_avx(auVar75);
        fVar35 = auVar40._0_4_ + auVar75._0_4_ + auVar70._0_4_ + auVar39._0_4_ + fVar35;
        for (; iVar21 < iVar29; iVar21 = iVar21 + 1) {
          fVar42 = *(float *)*pauVar20 - fVar44;
          fVar35 = fVar42 * fVar42 + fVar35;
          pauVar20 = (undefined1 (*) [32])(*pauVar20 + 4);
        }
      }
      pfVar31 = (float *)(*(long *)(&this->field_0x128 + (long)p_Var30) +
                         lVar14 * *(long *)(&this->field_0x138 + (long)p_Var30));
      fVar35 = fVar35 * fVar43 + *(float *)(&this->field_0xd8 + (long)p_Var30);
      auVar51 = vrsqrtss_avx(ZEXT416((uint)fVar35),ZEXT416((uint)fVar35));
      fVar42 = auVar51._0_4_;
      fVar35 = fVar42 * -0.5 * (fVar35 * fVar42 * fVar42 + -3.0);
      pp_Var5 = this->_vptr_GroupNorm_x86_avx;
      for (uVar15 = 0; uVar15 != uVar16; uVar15 = uVar15 + 1) {
        fVar45 = fVar35;
        fVar42 = fVar35 * -fVar44;
        if (*(int *)(&this->field_0xdc + (long)pp_Var5[-3]) != 0) {
          fVar45 = *pfVar19 * fVar35;
          fVar42 = *pfVar19 * fVar35 * -fVar44 + *pfVar31;
        }
        pauVar24 = (undefined1 (*) [16])((long)pvVar4 + lVar18 * uVar15 + lVar22);
        auVar51 = vshufps_avx(ZEXT416((uint)fVar45),ZEXT416((uint)fVar45),0);
        auVar39 = vshufps_avx(ZEXT416((uint)fVar42),ZEXT416((uint)fVar42),0);
        iVar21 = 0;
        while( true ) {
          fVar55 = auVar51._0_4_;
          fVar72 = auVar51._4_4_;
          fVar71 = auVar51._8_4_;
          fVar46 = auVar39._0_4_;
          fVar47 = auVar39._4_4_;
          fVar48 = auVar39._8_4_;
          fVar61 = auVar39._12_4_;
          if (iVar29 <= iVar21 + 7) break;
          fVar6 = *(float *)(*pauVar24 + 4);
          fVar7 = *(float *)(*pauVar24 + 8);
          fVar8 = *(float *)(*pauVar24 + 0xc);
          fVar9 = *(float *)pauVar24[1];
          fVar10 = *(float *)(pauVar24[1] + 4);
          fVar11 = *(float *)(pauVar24[1] + 8);
          in_register_0000151c = in_register_0000151c + fVar61;
          *(float *)*pauVar24 = fVar55 * *(float *)*pauVar24 + fVar46;
          *(float *)(*pauVar24 + 4) = fVar72 * fVar6 + fVar47;
          *(float *)(*pauVar24 + 8) = fVar71 * fVar7 + fVar48;
          *(float *)(*pauVar24 + 0xc) = auVar51._12_4_ * fVar8 + fVar61;
          *(float *)pauVar24[1] = fVar55 * fVar9 + fVar46;
          *(float *)(pauVar24[1] + 4) = fVar72 * fVar10 + fVar47;
          *(float *)(pauVar24[1] + 8) = fVar71 * fVar11 + fVar48;
          *(float *)(pauVar24[1] + 0xc) = in_register_0000151c;
          pauVar24 = pauVar24 + 2;
          iVar21 = iVar21 + 8;
        }
        for (; iVar21 + 3 < iVar29; iVar21 = iVar21 + 4) {
          auVar76._0_4_ = fVar55 * *(float *)*pauVar24 + fVar46;
          auVar76._4_4_ = fVar72 * *(float *)(*pauVar24 + 4) + fVar47;
          auVar76._8_4_ = fVar71 * *(float *)(*pauVar24 + 8) + fVar48;
          auVar76._12_4_ = auVar51._12_4_ * *(float *)(*pauVar24 + 0xc) + fVar61;
          *pauVar24 = auVar76;
          pauVar24 = pauVar24 + 1;
        }
        for (; iVar21 < iVar29; iVar21 = iVar21 + 1) {
          *(float *)*pauVar24 = fVar45 * *(float *)*pauVar24 + fVar42;
          pauVar24 = (undefined1 (*) [16])(*pauVar24 + 4);
        }
        pfVar19 = pfVar19 + 1;
        pfVar31 = pfVar31 + 1;
      }
      p_Var30 = pp_Var3[-3];
      iVar21 = *(int *)(&this->field_0xd0 + (long)p_Var30);
    }
  }
  return 0;
}

Assistant:

int GroupNorm_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    const int dims = bottom_top_blob.dims;
    const int channels_per_group = channels / group;

    if (dims == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            Mat bottom_top_blob_g = bottom_top_blob.range(g * channels_per_group, channels_per_group);
            const Mat gamma_data_g = gamma_data.range(g * channels_per_group, channels_per_group);
            const Mat beta_data_g = beta_data.range(g * channels_per_group, channels_per_group);

            float sum = 0.f;
            float* ptr = bottom_top_blob_g;
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sum_avx512 = _mm512_setzero_ps();
                for (; i + 15 < channels_per_group; i += 16)
                {
                    _sum_avx512 = _mm512_add_ps(_sum_avx512, _mm512_loadu_ps(ptr));
                    ptr += 16;
                }
                sum += _mm512_comp_reduce_add_ps(_sum_avx512);
#endif // __AVX512F__
                __m256 _sum_avx = _mm256_setzero_ps();
                for (; i + 7 < channels_per_group; i += 8)
                {
                    _sum_avx = _mm256_add_ps(_sum_avx, _mm256_loadu_ps(ptr));
                    ptr += 8;
                }
                sum += _mm256_reduce_add_ps(_sum_avx);
#endif // __AVX__
                __m128 _sum = _mm_setzero_ps();
                for (; i + 3 < channels_per_group; i += 4)
                {
                    _sum = _mm_add_ps(_sum, _mm_loadu_ps(ptr));
                    ptr += 4;
                }
                sum += _mm_reduce_add_ps(_sum);
#endif // __SSE2__
                for (; i < channels_per_group; i++)
                {
                    sum += *ptr;
                    ptr++;
                }
            }

            float mean = sum / channels_per_group;

            float sqsum = 0.f;
            ptr = bottom_top_blob_g;
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sqsum_avx512 = _mm512_setzero_ps();
                __m512 _mean_avx512 = _mm512_set1_ps(mean);
                for (; i + 15 < channels_per_group; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_sub_ps(_p, _mean_avx512);
                    _p = _mm512_mul_ps(_p, _p);
                    _sqsum_avx512 = _mm512_add_ps(_p, _sqsum_avx512);
                    ptr += 16;
                }
                sqsum += _mm512_comp_reduce_add_ps(_sqsum_avx512);
#endif // __AVX512F__
                __m256 _sqsum_avx = _mm256_setzero_ps();
                __m256 _mean_avx = _mm256_set1_ps(mean);
                for (; i + 7 < channels_per_group; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_sub_ps(_p, _mean_avx);
                    _sqsum_avx = _mm256_comp_fmadd_ps(_p, _p, _sqsum_avx);
                    ptr += 8;
                }
                sqsum += _mm256_reduce_add_ps(_sqsum_avx);
#endif // __AVX__
                __m128 _sqsum = _mm_setzero_ps();
                __m128 _mean = _mm_set1_ps(mean);
                for (; i + 3 < channels_per_group; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_sub_ps(_p, _mean);
                    _sqsum = _mm_comp_fmadd_ps(_p, _p, _sqsum);
                    ptr += 4;
                }
                sqsum += _mm_reduce_add_ps(_sqsum);
#endif // __SSE2__
                for (; i < channels_per_group; i++)
                {
                    float tmp = *ptr - mean;
                    sqsum += tmp * tmp;
                    ptr++;
                }
            }

            float scale1 = 1.f / sqrtf(sqsum / channels_per_group + eps);
            float scale2 = -mean * scale1;

            ptr = bottom_top_blob_g;
            if (affine)
            {
                int i = 0;
                const float* gamma = gamma_data_g;
                const float* beta = beta_data_g;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _scale1_avx512 = _mm512_set1_ps(scale1);
                __m512 _scale2_avx512 = _mm512_set1_ps(scale2);
                for (; i + 15 < channels_per_group; i += 16)
                {
                    __m512 _gamma = _mm512_loadu_ps(gamma);
                    __m512 _beta = _mm512_loadu_ps(beta);
                    __m512 _p = _mm512_loadu_ps(ptr);
                    __m512 _a = _mm512_mul_ps(_gamma, _scale1_avx512);
                    __m512 _b = _mm512_add_ps(_mm512_mul_ps(_gamma, _scale2_avx512), _beta);
                    _p = _mm512_add_ps(_mm512_mul_ps(_p, _a), _b);
                    _mm512_storeu_ps(ptr, _p);
                    gamma += 16;
                    beta += 16;
                    ptr += 16;
                }
#endif // __AVX512F__
                __m256 _scale1_avx = _mm256_set1_ps(scale1);
                __m256 _scale2_avx = _mm256_set1_ps(scale2);
                for (; i + 7 < channels_per_group; i += 8)
                {
                    __m256 _gamma = _mm256_loadu_ps(gamma);
                    __m256 _beta = _mm256_loadu_ps(beta);
                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _a = _mm256_mul_ps(_gamma, _scale1_avx);
                    __m256 _b = _mm256_comp_fmadd_ps(_gamma, _scale2_avx, _beta);
                    _p = _mm256_comp_fmadd_ps(_p, _a, _b);
                    _mm256_storeu_ps(ptr, _p);
                    gamma += 8;
                    beta += 8;
                    ptr += 8;
                }
#endif // __AVX__
                __m128 _scale1 = _mm_set1_ps(scale1);
                __m128 _scale2 = _mm_set1_ps(scale2);
                for (; i + 3 < channels_per_group; i += 4)
                {
                    __m128 _gamma = _mm_loadu_ps(gamma);
                    __m128 _beta = _mm_loadu_ps(beta);
                    __m128 _p = _mm_loadu_ps(ptr);
                    __m128 _a = _mm_mul_ps(_gamma, _scale1);
                    __m128 _b = _mm_comp_fmadd_ps(_gamma, _scale2, _beta);
                    _p = _mm_comp_fmadd_ps(_p, _a, _b);
                    _mm_storeu_ps(ptr, _p);
                    gamma += 4;
                    beta += 4;
                    ptr += 4;
                }
#endif // __SSE2__
                for (; i < channels_per_group; i++)
                {
                    float a = *gamma * scale1;
                    float b = *gamma * scale2 + *beta;
                    *ptr = *ptr * a + b;
                    gamma++;
                    beta++;
                    ptr++;
                }
            }
            else
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _scale1_avx512 = _mm512_set1_ps(scale1);
                __m512 _scale2_avx512 = _mm512_set1_ps(scale2);
                for (; i + 15 < channels_per_group; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_add_ps(_mm512_mul_ps(_p, _scale1_avx512), _scale2_avx512);
                    _mm512_storeu_ps(ptr, _p);
                    ptr += 16;
                }
#endif // __AVX512F__
                __m256 _scale1_avx = _mm256_set1_ps(scale1);
                __m256 _scale2_avx = _mm256_set1_ps(scale2);
                for (; i + 7 < channels_per_group; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_comp_fmadd_ps(_p, _scale1_avx, _scale2_avx);
                    _mm256_storeu_ps(ptr, _p);
                    ptr += 8;
                }
#endif // __AVX__
                __m128 _scale1 = _mm_set1_ps(scale1);
                __m128 _scale2 = _mm_set1_ps(scale2);
                for (; i + 3 < channels_per_group; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_comp_fmadd_ps(_p, _scale1, _scale2);
                    _mm_storeu_ps(ptr, _p);
                    ptr += 4;
                }
#endif // __SSE2__
                for (; i < channels_per_group; i++)
                {
                    *ptr = *ptr * scale1 + scale2;
                    ptr++;
                }
            }
        }

        return 0;
    }

    if (dims == 2)
    {
        int w = bottom_top_blob.w;
        int size = channels_per_group * w;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            Mat bottom_top_blob_g = bottom_top_blob.row_range(g * channels_per_group, channels_per_group);
            const Mat gamma_data_g = gamma_data.range(g * channels_per_group, channels_per_group);
            const Mat beta_data_g = beta_data.range(g * channels_per_group, channels_per_group);

            // mean and var
            float sum = 0.f;
            float* ptr = bottom_top_blob_g;
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sum_avx512 = _mm512_setzero_ps();
                for (; i + 15 < size; i += 16)
                {
                    _sum_avx512 = _mm512_add_ps(_sum_avx512, _mm512_loadu_ps(ptr));
                    ptr += 16;
                }
                sum += _mm512_comp_reduce_add_ps(_sum_avx512);
#endif // __AVX512F__
                __m256 _sum_avx = _mm256_setzero_ps();
                for (; i + 7 < size; i += 8)
                {
                    _sum_avx = _mm256_add_ps(_sum_avx, _mm256_loadu_ps(ptr));
                    ptr += 8;
                }
                sum += _mm256_reduce_add_ps(_sum_avx);
#endif // __AVX__
                __m128 _sum = _mm_setzero_ps();
                for (; i + 3 < size; i += 4)
                {
                    _sum = _mm_add_ps(_sum, _mm_loadu_ps(ptr));
                    ptr += 4;
                }
                sum += _mm_reduce_add_ps(_sum);
#endif // __SSE2__
                for (; i < size; i++)
                {
                    sum += *ptr;
                    ptr++;
                }
            }

            float mean = sum / size;

            float sqsum = 0.f;
            ptr = bottom_top_blob_g;
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sqsum_avx512 = _mm512_setzero_ps();
                __m512 _mean_avx512 = _mm512_set1_ps(mean);
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_sub_ps(_p, _mean_avx512);
                    _p = _mm512_mul_ps(_p, _p);
                    _sqsum_avx512 = _mm512_add_ps(_p, _sqsum_avx512);
                    ptr += 16;
                }
                sqsum += _mm512_comp_reduce_add_ps(_sqsum_avx512);
#endif // __AVX512F__
                __m256 _sqsum_avx = _mm256_setzero_ps();
                __m256 _mean_avx = _mm256_set1_ps(mean);
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_sub_ps(_p, _mean_avx);
                    _sqsum_avx = _mm256_comp_fmadd_ps(_p, _p, _sqsum_avx);
                    ptr += 8;
                }
                sqsum += _mm256_reduce_add_ps(_sqsum_avx);
#endif // __AVX__
                __m128 _sqsum = _mm_setzero_ps();
                __m128 _mean = _mm_set1_ps(mean);
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_sub_ps(_p, _mean);
                    _sqsum = _mm_comp_fmadd_ps(_p, _p, _sqsum);
                    ptr += 4;
                }
                sqsum += _mm_reduce_add_ps(_sqsum);
#endif // __SSE2__
                for (; i < size; i++)
                {
                    float tmp = *ptr - mean;
                    sqsum += tmp * tmp;
                    ptr++;
                }
            }

            float scale1 = 1.f / sqrtf(sqsum / size + eps);
            float scale2 = -mean * scale1;

            ptr = bottom_top_blob_g;
            if (affine)
            {
                const float* gamma = gamma_data_g;
                const float* beta = beta_data_g;
                for (int q = 0; q < channels_per_group; q++)
                {
                    float a = *gamma * scale1;
                    float b = *gamma * scale2 + *beta;
                    int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                    __m512 _a_avx512 = _mm512_set1_ps(a);
                    __m512 _b_avx512 = _mm512_set1_ps(b);
                    for (; i + 15 < w; i += 16)
                    {
                        __m512 _p = _mm512_loadu_ps(ptr);
                        _p = _mm512_add_ps(_mm512_mul_ps(_p, _a_avx512), _b_avx512);
                        _mm512_storeu_ps(ptr, _p);
                        ptr += 16;
                    }
#endif // __AVX512F__
                    __m256 _a_avx = _mm256_set1_ps(a);
                    __m256 _b_avx = _mm256_set1_ps(b);
                    for (; i + 7 < w; i += 8)
                    {
                        __m256 _p = _mm256_loadu_ps(ptr);
                        _p = _mm256_comp_fmadd_ps(_p, _a_avx, _b_avx);
                        _mm256_storeu_ps(ptr, _p);
                        ptr += 8;
                    }
#endif // __AVX__
                    __m128 _a = _mm_set1_ps(a);
                    __m128 _b = _mm_set1_ps(b);
                    for (; i + 3 < w; i += 4)
                    {
                        __m128 _p = _mm_loadu_ps(ptr);
                        _p = _mm_comp_fmadd_ps(_p, _a, _b);
                        _mm_storeu_ps(ptr, _p);
                        ptr += 4;
                    }
#endif // __SSE2__
                    for (; i < w; i++)
                    {
                        *ptr = *ptr * a + b;
                        ptr++;
                    }
                    gamma++;
                    beta++;
                }
            }
            else
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _scale1_avx512 = _mm512_set1_ps(scale1);
                __m512 _scale2_avx512 = _mm512_set1_ps(scale2);
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_add_ps(_mm512_mul_ps(_p, _scale1_avx512), _scale2_avx512);
                    _mm512_storeu_ps(ptr, _p);
                    ptr += 16;
                }
#endif // __AVX512F__
                __m256 _scale1_avx = _mm256_set1_ps(scale1);
                __m256 _scale2_avx = _mm256_set1_ps(scale2);
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_comp_fmadd_ps(_p, _scale1_avx, _scale2_avx);
                    _mm256_storeu_ps(ptr, _p);
                    ptr += 8;
                }
#endif // __AVX__
                __m128 _scale1 = _mm_set1_ps(scale1);
                __m128 _scale2 = _mm_set1_ps(scale2);
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_comp_fmadd_ps(_p, _scale1, _scale2);
                    _mm_storeu_ps(ptr, _p);
                    ptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *ptr = *ptr * scale1 + scale2;
                    ptr++;
                }
            }
        }

        return 0;
    }

    if (dims == 3 || dims == 4)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int d = bottom_top_blob.d;
        int size = w * h * d;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            Mat bottom_top_blob_g = bottom_top_blob.channel_range(g * channels_per_group, channels_per_group);
            const Mat gamma_data_g = gamma_data.range(g * channels_per_group, channels_per_group);
            const Mat beta_data_g = beta_data.range(g * channels_per_group, channels_per_group);

            // mean and var
            float sum = 0.f;
            for (int q = 0; q < channels_per_group; q++)
            {
                const float* ptr = bottom_top_blob_g.channel(q);
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sum_avx512 = _mm512_setzero_ps();
                for (; i + 15 < size; i += 16)
                {
                    _sum_avx512 = _mm512_add_ps(_sum_avx512, _mm512_loadu_ps(ptr));
                    ptr += 16;
                }
                sum += _mm512_comp_reduce_add_ps(_sum_avx512);
#endif // __AVX512F__
                __m256 _sum_avx = _mm256_setzero_ps();
                for (; i + 7 < size; i += 8)
                {
                    _sum_avx = _mm256_add_ps(_sum_avx, _mm256_loadu_ps(ptr));
                    ptr += 8;
                }
                sum += _mm256_reduce_add_ps(_sum_avx);
#endif // __AVX__
                __m128 _sum = _mm_setzero_ps();
                for (; i + 3 < size; i += 4)
                {
                    _sum = _mm_add_ps(_sum, _mm_loadu_ps(ptr));
                    ptr += 4;
                }
                sum += _mm_reduce_add_ps(_sum);
#endif // __SSE2__
                for (; i < size; i++)
                {
                    sum += *ptr;
                    ptr++;
                }
            }

            float mean = sum / (channels_per_group * size);

            float sqsum = 0.f;
            for (int q = 0; q < channels_per_group; q++)
            {
                const float* ptr = bottom_top_blob_g.channel(q);
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sqsum_avx512 = _mm512_setzero_ps();
                __m512 _mean_avx512 = _mm512_set1_ps(mean);
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_sub_ps(_p, _mean_avx512);
                    _p = _mm512_mul_ps(_p, _p);
                    _sqsum_avx512 = _mm512_add_ps(_p, _sqsum_avx512);
                    ptr += 16;
                }
                sqsum += _mm512_comp_reduce_add_ps(_sqsum_avx512);
#endif // __AVX512F__
                __m256 _sqsum_avx = _mm256_setzero_ps();
                __m256 _mean_avx = _mm256_set1_ps(mean);
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_sub_ps(_p, _mean_avx);
                    _sqsum_avx = _mm256_comp_fmadd_ps(_p, _p, _sqsum_avx);
                    ptr += 8;
                }
                sqsum += _mm256_reduce_add_ps(_sqsum_avx);
#endif // __AVX__
                __m128 _sqsum = _mm_setzero_ps();
                __m128 _mean = _mm_set1_ps(mean);
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_sub_ps(_p, _mean);
                    _sqsum = _mm_comp_fmadd_ps(_p, _p, _sqsum);
                    ptr += 4;
                }
                sqsum += _mm_reduce_add_ps(_sqsum);
#endif // __SSE2__
                for (; i < size; i++)
                {
                    float tmp = *ptr - mean;
                    sqsum += tmp * tmp;
                    ptr++;
                }
            }

            float scale1 = 1.f / sqrtf(sqsum / (channels_per_group * size) + eps);
            float scale2 = -mean * scale1;

            const float* gamma = gamma_data_g;
            const float* beta = beta_data_g;
            for (int q = 0; q < channels_per_group; q++)
            {
                float a = scale1;
                float b = scale2;
                if (affine)
                {
                    a = *gamma * a;
                    b = *gamma * b + *beta;
                }

                float* ptr = bottom_top_blob_g.channel(q);
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _a_avx512 = _mm512_set1_ps(a);
                __m512 _b_avx512 = _mm512_set1_ps(b);
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_add_ps(_mm512_mul_ps(_p, _a_avx512), _b_avx512);
                    _mm512_storeu_ps(ptr, _p);
                    ptr += 16;
                }
#endif // __AVX512F__
                __m256 _a_avx = _mm256_set1_ps(a);
                __m256 _b_avx = _mm256_set1_ps(b);
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_comp_fmadd_ps(_p, _a_avx, _b_avx);
                    _mm256_storeu_ps(ptr, _p);
                    ptr += 8;
                }
#endif // __AVX__
                __m128 _a = _mm_set1_ps(a);
                __m128 _b = _mm_set1_ps(b);
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_comp_fmadd_ps(_p, _a, _b);
                    _mm_storeu_ps(ptr, _p);
                    ptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *ptr = *ptr * a + b;
                    ptr++;
                }

                gamma++;
                beta++;
            }
        }

        return 0;
    }

    return 0;
}